

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>,Eigen::internal::swap_assign_op<float>>
               (Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *dst,
               Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *src,
               swap_assign_op<float> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  DstEvaluatorType local_40;
  SrcEvaluatorType local_30;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>
  local_20;
  
  local_30.super_block_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  .m_data = (src->super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data;
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_src = &local_30;
  local_40.super_block_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  .m_data = (dst->super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data;
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_dst = &local_40;
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_functor = func;
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
  .m_dstExpr = dst;
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>,_0,_3>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}